

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O1

int absl::lts_20250127::str_format_internal::FprintF
              (FILE *output,UntypedFormatSpecImpl format,
              Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  FormatRawSinkImpl raw_sink;
  FILERawSink sink;
  FILE *local_20;
  int local_18;
  ulong local_10;
  
  local_18 = 0;
  local_10 = 0;
  raw_sink.write_ = FormatRawSinkImpl::Flush<absl::lts_20250127::str_format_internal::FILERawSink>;
  raw_sink.sink_ = &local_20;
  local_20 = output;
  bVar2 = FormatUntyped(raw_sink,format,args);
  iVar1 = local_18;
  if (bVar2) {
    if (local_18 == 0) {
      if ((local_10 & 0xffffffff80000000) == 0) goto LAB_002dbd8f;
      piVar3 = __errno_location();
      *piVar3 = 0x1b;
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = iVar1;
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  local_10 = 0xffffffff;
LAB_002dbd8f:
  return (int)local_10;
}

Assistant:

int FprintF(std::FILE* output, const UntypedFormatSpecImpl format,
            absl::Span<const FormatArgImpl> args) {
  FILERawSink sink(output);
  if (!FormatUntyped(&sink, format, args)) {
    errno = EINVAL;
    return -1;
  }
  if (sink.error()) {
    errno = sink.error();
    return -1;
  }
  if (sink.count() > static_cast<size_t>(std::numeric_limits<int>::max())) {
    errno = EFBIG;
    return -1;
  }
  return static_cast<int>(sink.count());
}